

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O2

void __thiscall
IndividualBeliefJESP::IndividualBeliefJESP
          (IndividualBeliefJESP *this,Index agentI,Index stage,PlanningUnitMADPDiscrete *pu)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  size_t *psVar4;
  uint uVar5;
  size_t sVar7;
  allocator_type local_89;
  value_type_conflict3 local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  Scope *local_70;
  size_t nrJOH_others;
  pointer_____offset_0xb8___ *local_60;
  size_t local_58;
  size_t nrOH_j;
  size_t nrS;
  ulong uVar3;
  Index IVar6;
  
  *(undefined ***)&this->super_Belief = &PTR__BeliefInterface_00603f50;
  local_60 = &PTR_PTR_00603da8;
  ::Belief::Belief(&this->super_Belief,&PTR_PTR_00603da8,0);
  *(undefined ***)&this->super_Belief = &PTR__IndividualBeliefJESP_00603cf0;
  this->_m_pumadp = pu;
  this->_m_stage = stage;
  this->_m_agentI = agentI;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = &this->_m_others;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_others).super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrOH_others).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = &this->_m_nrOH_others;
  local_78 = &this->_m_sizeVec;
  sVar2 = PlanningUnitMADPDiscrete::GetNrStates(pu);
  nrS = sVar2;
  iVar1 = (*(this->_m_pumadp->super_PlanningUnit)._vptr_PlanningUnit[6])();
  uVar3 = CONCAT44(extraout_var,iVar1);
  this->_m_nrAgents = uVar3;
  uVar5 = 0;
  nrJOH_others = 1;
  sVar7 = 1;
  local_58 = sVar2;
  while( true ) {
    local_88 = (value_type_conflict3)CONCAT44(local_88._4_4_,uVar5);
    if (uVar3 <= uVar5) break;
    IVar6 = agentI;
    if (uVar5 != agentI) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&local_70->super_SDT,(value_type_conflict1 *)&local_88);
      nrOH_j = PlanningUnitMADPDiscrete::GetNrObservationHistories
                         (this->_m_pumadp,local_88._0_4_,stage);
      sVar7 = sVar7 * nrOH_j;
      nrJOH_others = sVar7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_80,&nrOH_j);
      uVar3 = this->_m_nrAgents;
      IVar6 = local_88._0_4_;
    }
    uVar5 = IVar6 + 1;
  }
  local_88 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&nrOH_j,sVar7 * local_58,&local_88,&local_89
            );
  this_00 = local_78;
  StateDistributionVector::operator=(&(this->super_Belief)._m_b,(SDV *)&nrOH_j);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&nrOH_j);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&nrS);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&nrJOH_others);
  psVar4 = IndexTools::CalculateStepSize(this_00);
  this->_m_stepsizeSJOH = psVar4;
  psVar4 = IndexTools::CalculateStepSize(local_80);
  this->_m_stepsizeJOHOH = psVar4;
  return;
}

Assistant:

IndividualBeliefJESP::IndividualBeliefJESP(Index agentI, Index stage,
    const PlanningUnitMADPDiscrete& pu) 
    :
    Belief(0),
    _m_pumadp(&pu),
    _m_stage(stage),
    _m_agentI(agentI)
{
    //compute size of  this belief:
    size_t nrS = _m_pumadp->GetNrStates();
    _m_nrAgents= _m_pumadp->GetNrAgents();
    size_t nrJOH_others = 1;
    for(Index j=0; j < _m_nrAgents; j++)
    {
        if(j == agentI)
            continue;
        //else:
        _m_others.push_back(j);
        size_t nrOH_j = _m_pumadp->GetNrObservationHistories(j, stage);
        nrJOH_others *=  nrOH_j;
        _m_nrOH_others.push_back(nrOH_j);
    }
    size_t size = nrS * nrJOH_others;
    _m_b = vector<double>(size,0.0);
    _m_sizeVec.push_back(nrS);
    _m_sizeVec.push_back(nrJOH_others);
    _m_stepsizeSJOH = IndexTools::CalculateStepSize(_m_sizeVec);

    //we will use 
    // IndexTools::JointToIndividualIndicesStepSize(Index jointI, 
    //      const vector<size_t> &step_size, size_t vec_size )
    //and
    // IndexTools::IndividualToJointIndicesStepSize (const std::vector< Index >
    //      &indices, const std::vector< size_t > &step_size)
    //
    // to do the conversions between JOHI_j <-> <OHI_1,...,OHI_nrA >
    //
    // so we cah the step_size
    _m_stepsizeJOHOH = IndexTools::CalculateStepSize(_m_nrOH_others);
}